

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O3

Type __thiscall QtPromise::resolve<QFuture<int>>(QtPromise *this,QFuture<int> *value)

{
  QSharedData *pQVar1;
  undefined8 *puVar2;
  Data *extraout_RAX;
  PromiseData<int> *extraout_RDX;
  PromiseData<int> *extraout_RDX_00;
  PromiseData<int> *extraout_RDX_01;
  PromiseData<int> *extraout_RDX_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  Type TVar4;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_38;
  QPromise<int> local_30;
  
  *(undefined ***)this = &PTR__QPromiseBase_001305a0;
  puVar2 = (undefined8 *)operator_new(0x68);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  *puVar2 = &PTR__PromiseDataBase_001308a8;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar2 + 2),0);
  *(undefined1 *)(puVar2 + 3) = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  *puVar2 = &PTR__PromiseData_00130840;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  *(undefined8 **)(this + 8) = puVar2;
  LOCK();
  *(int *)(puVar2 + 1) = *(int *)(puVar2 + 1) + 1;
  UNLOCK();
  local_30.super_QPromiseBase<int>.m_d.d = *(PromiseData<int> **)(this + 8);
  if (local_30.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00130808;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver
            ((PromiseResolver<int> *)&local_40,&local_30);
  local_30.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001305a0;
  if (local_30.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_30.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_30.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_40.d == (Data *)0x0) {
    local_48.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_48.d = local_40.d;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_38.d = local_40.d;
      goto LAB_00111452;
    }
  }
  local_38.d = (Data *)0x0;
LAB_00111452:
  QtPromisePrivate::PromiseFulfill<QFuture<int>_>::call
            (value,(QPromiseResolve<int> *)&local_48,(QPromiseReject<int> *)&local_38);
  QVar3.d = extraout_RDX;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_38.d,0x10);
      QVar3.d = extraout_RDX_00;
    }
  }
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_48.d,0x10);
      QVar3.d = extraout_RDX_01;
    }
  }
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_40.d,0x10);
      local_40.d = extraout_RAX;
      QVar3.d = extraout_RDX_02;
    }
  }
  *(undefined ***)this = &PTR__QPromiseBase_00130808;
  TVar4.super_QPromiseBase<int>.m_d.d = QVar3.d;
  TVar4.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_40.d;
  return (Type)TVar4.super_QPromiseBase<int>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}